

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

Conjuncts *
CheckTablesCacheAndReturn(DdNode *node,DdNode *g,DdNode *h,st__table *ghTable,st__table *cacheTable)

{
  int iVar1;
  DdNode *value_00;
  Conjuncts *factors;
  int value;
  int pairValue;
  st__table *cacheTable_local;
  st__table *ghTable_local;
  DdNode *h_local;
  DdNode *g_local;
  DdNode *node_local;
  
  factors._0_4_ = 0;
  _value = cacheTable;
  cacheTable_local = ghTable;
  ghTable_local = (st__table *)h;
  h_local = g;
  g_local = node;
  factors._4_4_ = PairInTables(g,h,ghTable);
  if (factors._4_4_ == 0) {
    __assert_fail("pairValue != NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddDecomp.c"
                  ,0x3f0,
                  "Conjuncts *CheckTablesCacheAndReturn(DdNode *, DdNode *, DdNode *, st__table *, st__table *)"
                 );
  }
  value_00 = (DdNode *)malloc(0x10);
  if (value_00 == (DdNode *)0x0) {
    node_local = (DdNode *)0x0;
  }
  else {
    if ((factors._4_4_ == 8) || (factors._4_4_ == 5)) {
      if (h_local != one) {
        factors._0_4_ = 0;
        iVar1 = st__lookup_int(cacheTable_local,(char *)((ulong)h_local & 0xfffffffffffffffe),
                               (int *)&factors);
        if (iVar1 == 0) {
          factors._0_4_ = 1;
        }
        else {
          factors._0_4_ = (uint)factors | 1;
        }
        iVar1 = st__insert(cacheTable_local,(char *)((ulong)h_local & 0xfffffffffffffffe),
                           (char *)(long)(int)(uint)factors);
        if (iVar1 == -10000) {
          return (Conjuncts *)0x0;
        }
      }
      *(DdNode **)value_00 = h_local;
      value_00->next = (DdNode *)ghTable_local;
    }
    else if ((factors._4_4_ == 7) || (factors._4_4_ == 3)) {
      if (ghTable_local != (st__table *)one) {
        factors._0_4_ = 0;
        iVar1 = st__lookup_int(cacheTable_local,(char *)((ulong)ghTable_local & 0xfffffffffffffffe),
                               (int *)&factors);
        if (iVar1 == 0) {
          factors._0_4_ = 2;
        }
        else {
          factors._0_4_ = (uint)factors | 2;
        }
        iVar1 = st__insert(cacheTable_local,(char *)((ulong)ghTable_local & 0xfffffffffffffffe),
                           (char *)(long)(int)(uint)factors);
        if (iVar1 == -10000) {
          return (Conjuncts *)0x0;
        }
      }
      *(DdNode **)value_00 = h_local;
      value_00->next = (DdNode *)ghTable_local;
    }
    else if (factors._4_4_ == 6) {
      if (h_local != one) {
        factors._0_4_ = 2;
        iVar1 = st__insert(cacheTable_local,(char *)((ulong)h_local & 0xfffffffffffffffe),
                           (char *)0x2);
        if (iVar1 == -10000) {
          return (Conjuncts *)0x0;
        }
      }
      *(st__table **)value_00 = ghTable_local;
      value_00->next = h_local;
    }
    else if (factors._4_4_ == 4) {
      if (ghTable_local != (st__table *)one) {
        factors._0_4_ = 1;
        iVar1 = st__insert(cacheTable_local,(char *)((ulong)ghTable_local & 0xfffffffffffffffe),
                           (char *)0x1);
        if (iVar1 == -10000) {
          return (Conjuncts *)0x0;
        }
      }
      *(st__table **)value_00 = ghTable_local;
      value_00->next = h_local;
    }
    else if (factors._4_4_ == 2) {
      *(st__table **)value_00 = ghTable_local;
      value_00->next = h_local;
    }
    else if (factors._4_4_ == 1) {
      *(DdNode **)value_00 = h_local;
      value_00->next = (DdNode *)ghTable_local;
    }
    iVar1 = st__insert(_value,(char *)g_local,(char *)value_00);
    node_local = value_00;
    if (iVar1 == -10000) {
      if (value_00 != (DdNode *)0x0) {
        free(value_00);
      }
      node_local = (DdNode *)0x0;
    }
  }
  return (Conjuncts *)node_local;
}

Assistant:

static Conjuncts *
CheckTablesCacheAndReturn(
  DdNode * node,
  DdNode * g,
  DdNode * h,
  st__table * ghTable,
  st__table * cacheTable)
{
    int pairValue;
    int value;
    Conjuncts *factors;
    
    value = 0;
    /* check tables */
    pairValue = PairInTables(g, h, ghTable);
    assert(pairValue != NONE);
    /* if both dont exist in table, we know one exists(either g or h).
     * Therefore store the other and proceed
     */
    factors = ABC_ALLOC(Conjuncts, 1);
    if (factors == NULL) return(NULL);
    if ((pairValue == BOTH_H) || (pairValue == H_ST)) {
        if (g != one) {
            value = 0;
            if ( st__lookup_int(ghTable, (char *)Cudd_Regular(g), &value)) {
                value |= 1;
            } else {
                value = 1;
            }
            if ( st__insert(ghTable, (char *)Cudd_Regular(g),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                return(NULL);
            }
        }
        factors->g = g;
        factors->h = h;
    } else  if ((pairValue == BOTH_G) || (pairValue == G_ST)) {
        if (h != one) {
            value = 0;
            if ( st__lookup_int(ghTable, (char *)Cudd_Regular(h), &value)) {
                value |= 2;
            } else {
                value = 2;
            }
            if ( st__insert(ghTable, (char *)Cudd_Regular(h),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                return(NULL);
            }
        }
        factors->g = g;
        factors->h = h;
    } else if (pairValue == H_CR) {
        if (g != one) {
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                return(NULL);
            }
        }
        factors->g = h;
        factors->h = g;
    } else if (pairValue == G_CR) {
        if (h != one) {
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                return(NULL);
            }
        }
        factors->g = h;
        factors->h = g;
    } else if (pairValue == PAIR_CR) {
    /* pair exists in table */
        factors->g = h;
        factors->h = g;
    } else if (pairValue == PAIR_ST) {
        factors->g = g;
        factors->h = h;
    }
            
    /* cache the result for this node */
    if ( st__insert(cacheTable, (char *)node, (char *)factors) == st__OUT_OF_MEM) {
        ABC_FREE(factors);
        return(NULL);
    }

    return(factors);

}